

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DefaultNetTypeDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultNetTypeDirectiveSyntax,slang::syntax::DefaultNetTypeDirectiveSyntax_const&>
          (BumpAllocator *this,DefaultNetTypeDirectiveSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  DefaultNetTypeDirectiveSyntax *pDVar13;
  
  pDVar13 = (DefaultNetTypeDirectiveSyntax *)allocate(this,0x38,8);
  uVar4 = *(undefined4 *)&(args->super_DirectiveSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DirectiveSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_DirectiveSyntax).super_SyntaxNode.previewNode;
  TVar5 = (args->super_DirectiveSyntax).directive.kind;
  uVar6 = (args->super_DirectiveSyntax).directive.field_0x2;
  NVar7.raw = (args->super_DirectiveSyntax).directive.numFlags.raw;
  uVar8 = (args->super_DirectiveSyntax).directive.rawLen;
  pIVar3 = (args->super_DirectiveSyntax).directive.info;
  TVar9 = (args->netType).kind;
  uVar10 = (args->netType).field_0x2;
  NVar11.raw = (args->netType).numFlags.raw;
  uVar12 = (args->netType).rawLen;
  (pDVar13->super_DirectiveSyntax).super_SyntaxNode.kind =
       (args->super_DirectiveSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar13->super_DirectiveSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pDVar13->super_DirectiveSyntax).super_SyntaxNode.parent = pSVar1;
  (pDVar13->super_DirectiveSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pDVar13->super_DirectiveSyntax).directive.kind = TVar5;
  (pDVar13->super_DirectiveSyntax).directive.field_0x2 = uVar6;
  (pDVar13->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar7.raw;
  (pDVar13->super_DirectiveSyntax).directive.rawLen = uVar8;
  (pDVar13->super_DirectiveSyntax).directive.info = pIVar3;
  (pDVar13->netType).kind = TVar9;
  (pDVar13->netType).field_0x2 = uVar10;
  (pDVar13->netType).numFlags = (NumericTokenFlags)NVar11.raw;
  (pDVar13->netType).rawLen = uVar12;
  (pDVar13->netType).info = (args->netType).info;
  return pDVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }